

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O3

Result __thiscall cmGeneratorExpressionDAGChecker::CheckGraph(cmGeneratorExpressionDAGChecker *this)

{
  cmGeneratorExpressionDAGChecker *pcVar1;
  pointer __s1;
  size_t __n;
  size_t __n_00;
  pointer __s1_00;
  int iVar2;
  cmGeneratorExpressionDAGChecker *pcVar3;
  
  pcVar1 = this->Parent;
  if (pcVar1 != (cmGeneratorExpressionDAGChecker *)0x0) {
    __s1 = (this->Target)._M_dataplus._M_p;
    __n = (this->Target)._M_string_length;
    __n_00 = (this->Property)._M_string_length;
    __s1_00 = (this->Property)._M_dataplus._M_p;
    pcVar3 = pcVar1;
    do {
      if (((__n == (pcVar3->Target)._M_string_length) &&
          (((__n == 0 || (iVar2 = bcmp(__s1,(pcVar3->Target)._M_dataplus._M_p,__n), iVar2 == 0)) &&
           (__n_00 == (pcVar3->Property)._M_string_length)))) &&
         ((__n_00 == 0 ||
          (iVar2 = bcmp(__s1_00,(pcVar3->Property)._M_dataplus._M_p,__n_00), iVar2 == 0)))) {
        return (pcVar3 != pcVar1) + SELF_REFERENCE;
      }
      pcVar3 = pcVar3->Parent;
    } while (pcVar3 != (cmGeneratorExpressionDAGChecker *)0x0);
  }
  return DAG;
}

Assistant:

cmGeneratorExpressionDAGChecker::Result
cmGeneratorExpressionDAGChecker::CheckGraph() const
{
  const cmGeneratorExpressionDAGChecker *parent = this->Parent;
  while (parent)
    {
    if (this->Target == parent->Target && this->Property == parent->Property)
      {
      return (parent == this->Parent) ? SELF_REFERENCE : CYCLIC_REFERENCE;
      }
    parent = parent->Parent;
    }
  return DAG;
}